

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

void __thiscall wasm::TypeUpdater::noteBreakChange(TypeUpdater *this,Name name,int change,Type type)

{
  Block *curr;
  iterator iVar1;
  int iVar2;
  undefined1 local_30 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_30 = name.super_IString.str._M_len;
  iVar1 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
          ::find(&(this->blockInfos)._M_t,(key_type *)local_30);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->blockInfos)._M_t._M_impl.super__Rb_tree_header) {
    iVar2 = *(int *)&iVar1._M_node[1]._M_right + change;
    *(int *)&iVar1._M_node[1]._M_right = iVar2;
    if (iVar2 < 0) {
      __assert_fail("info.numBreaks >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.h"
                    ,0xbd,"void wasm::TypeUpdater::noteBreakChange(Name, int, Type)");
    }
    curr = (Block *)iVar1._M_node[1]._M_left;
    if (curr != (Block *)0x0) {
      if (iVar2 == 0) {
        makeBlockUnreachableIfNoFallThrough(this,curr);
      }
      else if (((change == 1) && (iVar2 == 1)) &&
              ((curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id ==
               1)) {
        changeTypeTo(this,(Expression *)curr,type);
      }
    }
  }
  return;
}

Assistant:

void noteBreakChange(Name name, int change, Type type) {
    auto iter = blockInfos.find(name);
    if (iter == blockInfos.end()) {
      return; // we can ignore breaks to loops
    }
    auto& info = iter->second;
    info.numBreaks += change;
    assert(info.numBreaks >= 0);
    auto* block = info.block;
    if (block) { // if to a loop, can ignore
      if (info.numBreaks == 0) {
        // dropped to 0! the block may now be unreachable. that
        // requires that it doesn't have a fallthrough
        makeBlockUnreachableIfNoFallThrough(block);
      } else if (change == 1 && info.numBreaks == 1) {
        // bumped to 1! the block may now be reachable
        if (block->type != Type::unreachable) {
          return; // was already reachable, had a fallthrough
        }
        changeTypeTo(block, type);
      }
    }
  }